

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathObjectCopy(xmlXPathObjectPtr val)

{
  xmlXPathObjectType xVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  xmlChar *pxVar16;
  xmlNodeSetPtr pxVar17;
  xmlXPathObjectPtr local_20;
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr val_local;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local = (xmlXPathObjectPtr)0x0;
  }
  else {
    local_20 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (local_20 == (xmlXPathObjectPtr)0x0) {
      val_local = (xmlXPathObjectPtr)0x0;
    }
    else {
      uVar2 = *(undefined4 *)&val->field_0x44;
      local_20->index2 = val->index2;
      *(undefined4 *)&local_20->field_0x44 = uVar2;
      xVar1 = val->type;
      uVar2 = *(undefined4 *)&val->field_0x4;
      uVar3 = *(undefined4 *)&val->nodesetval;
      uVar4 = *(undefined4 *)((long)&val->nodesetval + 4);
      iVar5 = val->boolval;
      uVar6 = *(undefined4 *)&val->field_0x14;
      uVar7 = *(undefined4 *)&val->floatval;
      uVar8 = *(undefined4 *)((long)&val->floatval + 4);
      uVar9 = *(undefined4 *)&val->stringval;
      uVar10 = *(undefined4 *)((long)&val->stringval + 4);
      uVar11 = *(undefined4 *)&val->user;
      uVar12 = *(undefined4 *)((long)&val->user + 4);
      uVar13 = *(undefined4 *)&val->field_0x34;
      uVar14 = *(undefined4 *)&val->user2;
      uVar15 = *(undefined4 *)((long)&val->user2 + 4);
      local_20->index = val->index;
      *(undefined4 *)&local_20->field_0x34 = uVar13;
      *(undefined4 *)&local_20->user2 = uVar14;
      *(undefined4 *)((long)&local_20->user2 + 4) = uVar15;
      *(undefined4 *)&local_20->stringval = uVar9;
      *(undefined4 *)((long)&local_20->stringval + 4) = uVar10;
      *(undefined4 *)&local_20->user = uVar11;
      *(undefined4 *)((long)&local_20->user + 4) = uVar12;
      local_20->boolval = iVar5;
      *(undefined4 *)&local_20->field_0x14 = uVar6;
      *(undefined4 *)&local_20->floatval = uVar7;
      *(undefined4 *)((long)&local_20->floatval + 4) = uVar8;
      local_20->type = xVar1;
      *(undefined4 *)&local_20->field_0x4 = uVar2;
      *(undefined4 *)&local_20->nodesetval = uVar3;
      *(undefined4 *)((long)&local_20->nodesetval + 4) = uVar4;
      switch(val->type) {
      case XPATH_NODESET:
      case XPATH_XSLT_TREE:
        pxVar17 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
        local_20->nodesetval = pxVar17;
        if (local_20->nodesetval == (xmlNodeSetPtr)0x0) {
          (*xmlFree)(local_20);
          return (xmlXPathObjectPtr)0x0;
        }
        local_20->boolval = 0;
        break;
      case XPATH_BOOLEAN:
      case XPATH_NUMBER:
        break;
      case XPATH_STRING:
        pxVar16 = xmlStrdup(val->stringval);
        local_20->stringval = pxVar16;
        if (local_20->stringval == (xmlChar *)0x0) {
          (*xmlFree)(local_20);
          return (xmlXPathObjectPtr)0x0;
        }
        break;
      default:
        (*xmlFree)(local_20);
        local_20 = (xmlXPathObjectPtr)0x0;
        break;
      case XPATH_USERS:
        local_20->user = val->user;
      }
      val_local = local_20;
    }
  }
  return val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathObjectCopy(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(NULL);

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL)
	return(NULL);
    memcpy(ret, val , sizeof(xmlXPathObject));
    switch (val->type) {
	case XPATH_BOOLEAN:
	case XPATH_NUMBER:
	    break;
	case XPATH_STRING:
	    ret->stringval = xmlStrdup(val->stringval);
            if (ret->stringval == NULL) {
                xmlFree(ret);
                return(NULL);
            }
	    break;
	case XPATH_XSLT_TREE:
	case XPATH_NODESET:
	    ret->nodesetval = xmlXPathNodeSetMerge(NULL, val->nodesetval);
            if (ret->nodesetval == NULL) {
                xmlFree(ret);
                return(NULL);
            }
	    /* Do not deallocate the copied tree value */
	    ret->boolval = 0;
	    break;
        case XPATH_USERS:
	    ret->user = val->user;
	    break;
        default:
            xmlFree(ret);
            ret = NULL;
	    break;
    }
    return(ret);
}